

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::SListLeaf::insert
          (SListLeaf *this,LeafData *ld)

{
  long in_RDI;
  Rhs *in_stack_00000008;
  SkipList<Inferences::ALASCA::SuperpositionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::LDComparator>
  *in_stack_00000010;
  Rhs local_58;
  
  Inferences::ALASCA::SuperpositionConf::Rhs::Rhs(&local_58,(Rhs *)(in_RDI + 0x10));
  Lib::
  SkipList<Inferences::ALASCA::SuperpositionConf::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Rhs>::LDComparator>
  ::insert(in_stack_00000010,in_stack_00000008);
  Inferences::ALASCA::SuperpositionConf::Rhs::~Rhs((Rhs *)0x4bdcd4);
  return;
}

Assistant:

void insert(LeafData ld) override { _children.insert(ld); }